

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_read_large.c
# Opt level: O0

void test_read_large(void)

{
  int iVar1;
  archive_entry *entry_00;
  archive *s;
  FILE *__stream;
  wchar_t unaff_retaddr;
  char *in_stack_00000008;
  FILE *f;
  archive_entry *entry;
  archive *a;
  size_t used;
  char tmpfilename [23];
  int tmpfilefd;
  uint i;
  int in_stack_000000a4;
  archive *in_stack_000000a8;
  archive_entry *in_stack_ffffffffffffff98;
  archive *a_00;
  archive_entry *in_stack_ffffffffffffffa0;
  char *a_01;
  archive *in_stack_ffffffffffffffa8;
  longlong v1;
  undefined4 in_stack_ffffffffffffffb0;
  wchar_t in_stack_ffffffffffffffb4;
  archive *in_stack_ffffffffffffffb8;
  void *in_stack_ffffffffffffffd0;
  archive *paVar2;
  char *e2;
  undefined4 uVar3;
  undefined2 uVar4;
  undefined1 uVar5;
  undefined1 in_stack_ffffffffffffffef;
  char *in_stack_fffffffffffffff0;
  undefined4 in_stack_fffffffffffffff8;
  uint uVar6;
  
  paVar2 = (archive *)0x6165722d74736574;
  e2 = (char *)0x2e656772616c5f64;
  uVar3 = 0x58585858;
  uVar4 = 0x5858;
  uVar5 = 0;
  for (uVar6 = 0; uVar6 < 0xa00000; uVar6 = uVar6 + 1) {
    iVar1 = rand();
    testdata[uVar6] = (uchar)iVar1;
  }
  archive_write_new();
  assertion_assert((char *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                   (wchar_t)((ulong)in_stack_ffffffffffffffa8 >> 0x20),
                   (wchar_t)in_stack_ffffffffffffffa8,(char *)in_stack_ffffffffffffffa0,
                   in_stack_ffffffffffffff98);
  archive_write_set_format_ustar(in_stack_ffffffffffffffa8);
  assertion_assert((char *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                   (wchar_t)((ulong)in_stack_ffffffffffffffa8 >> 0x20),
                   (wchar_t)in_stack_ffffffffffffffa8,(char *)in_stack_ffffffffffffffa0,
                   in_stack_ffffffffffffff98);
  archive_write_open_memory
            (in_stack_ffffffffffffffb8,
             (void *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
             (size_t)in_stack_ffffffffffffffa8,(size_t *)in_stack_ffffffffffffffa0);
  assertion_assert((char *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                   (wchar_t)((ulong)in_stack_ffffffffffffffa8 >> 0x20),
                   (wchar_t)in_stack_ffffffffffffffa8,(char *)in_stack_ffffffffffffffa0,
                   in_stack_ffffffffffffff98);
  entry_00 = archive_entry_new();
  assertion_assert((char *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                   (wchar_t)((ulong)in_stack_ffffffffffffffa8 >> 0x20),
                   (wchar_t)in_stack_ffffffffffffffa8,(char *)in_stack_ffffffffffffffa0,
                   in_stack_ffffffffffffff98);
  archive_entry_set_size(entry_00,0xa00000);
  archive_entry_set_mode(entry_00,0x81ff);
  archive_entry_set_pathname(in_stack_ffffffffffffffa0,(char *)in_stack_ffffffffffffff98);
  archive_write_header((archive *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  assertion_assert((char *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                   (wchar_t)((ulong)in_stack_ffffffffffffffa8 >> 0x20),
                   (wchar_t)in_stack_ffffffffffffffa8,(char *)in_stack_ffffffffffffffa0,
                   in_stack_ffffffffffffff98);
  archive_entry_free((archive_entry *)0x1c4640);
  archive_write_data((archive *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,0x1c4656);
  assertion_assert((char *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                   (wchar_t)((ulong)in_stack_ffffffffffffffa8 >> 0x20),
                   (wchar_t)in_stack_ffffffffffffffa8,(char *)in_stack_ffffffffffffffa0,
                   in_stack_ffffffffffffff98);
  archive_write_free((archive *)0x1c4690);
  a_00 = (archive *)0x0;
  assertion_equal_int((char *)in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb4,
                      (longlong)in_stack_ffffffffffffffa8,(char *)in_stack_ffffffffffffffa0,0,
                      (char *)0x1c46be,in_stack_ffffffffffffffd0);
  s = archive_read_new();
  assertion_assert((char *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                   (wchar_t)((ulong)in_stack_ffffffffffffffa8 >> 0x20),
                   (wchar_t)in_stack_ffffffffffffffa8,(char *)in_stack_ffffffffffffffa0,a_00);
  archive_read_support_format_all(a_00);
  assertion_assert((char *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                   (wchar_t)((ulong)in_stack_ffffffffffffffa8 >> 0x20),
                   (wchar_t)in_stack_ffffffffffffffa8,(char *)in_stack_ffffffffffffffa0,a_00);
  archive_read_support_filter_all(a_00);
  assertion_assert((char *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                   (wchar_t)((ulong)in_stack_ffffffffffffffa8 >> 0x20),
                   (wchar_t)in_stack_ffffffffffffffa8,(char *)in_stack_ffffffffffffffa0,a_00);
  archive_read_open_memory((archive *)in_stack_ffffffffffffffa0,a_00,0x1c4775);
  assertion_assert((char *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                   (wchar_t)((ulong)in_stack_ffffffffffffffa8 >> 0x20),
                   (wchar_t)in_stack_ffffffffffffffa8,(char *)in_stack_ffffffffffffffa0,a_00);
  archive_read_next_header((archive *)in_stack_ffffffffffffffa0,(archive_entry **)a_00);
  assertion_assert((char *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                   (wchar_t)((ulong)in_stack_ffffffffffffffa8 >> 0x20),
                   (wchar_t)in_stack_ffffffffffffffa8,(char *)in_stack_ffffffffffffffa0,a_00);
  archive_read_data(paVar2,in_stack_ffffffffffffffd0,(size_t)s);
  assertion_equal_int((char *)in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb4,
                      (longlong)in_stack_ffffffffffffffa8,(char *)in_stack_ffffffffffffffa0,
                      (longlong)s,(char *)0x1c4820,in_stack_ffffffffffffffd0);
  archive_read_free((archive *)0x1c482a);
  assertion_equal_int((char *)in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb4,
                      (longlong)in_stack_ffffffffffffffa8,(char *)in_stack_ffffffffffffffa0,0,
                      (char *)0x1c4858,in_stack_ffffffffffffffd0);
  paVar2 = (archive *)(buff1 + 0x6cb350);
  a_01 = "sizeof(testdata)";
  v1 = 0;
  assertion_equal_mem(in_stack_00000008,unaff_retaddr,
                      (void *)CONCAT44(uVar6,in_stack_fffffffffffffff8),in_stack_fffffffffffffff0,
                      (void *)CONCAT17(in_stack_ffffffffffffffef,
                                       CONCAT16(uVar5,CONCAT24(uVar4,uVar3))),e2,(size_t)f,
                      (char *)entry,a);
  archive_read_new();
  assertion_assert((char *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                   (wchar_t)((ulong)v1 >> 0x20),(wchar_t)v1,a_01,paVar2);
  archive_read_support_format_all(paVar2);
  assertion_assert((char *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                   (wchar_t)((ulong)v1 >> 0x20),(wchar_t)v1,a_01,paVar2);
  archive_read_support_filter_all(paVar2);
  assertion_assert((char *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                   (wchar_t)((ulong)v1 >> 0x20),(wchar_t)v1,a_01,paVar2);
  archive_read_open_memory((archive *)a_01,paVar2,0x1c495c);
  assertion_assert((char *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                   (wchar_t)((ulong)v1 >> 0x20),(wchar_t)v1,a_01,paVar2);
  archive_read_next_header((archive *)a_01,(archive_entry **)paVar2);
  assertion_assert((char *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                   (wchar_t)((ulong)v1 >> 0x20),(wchar_t)v1,a_01,paVar2);
  iVar1 = open(&stack0xffffffffffffffd8,0x41,0x1ed);
  assertion_assert((char *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                   (wchar_t)((ulong)v1 >> 0x20),(wchar_t)v1,a_01,paVar2);
  archive_read_data_into_fd(in_stack_000000a8,in_stack_000000a4);
  assertion_assert((char *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                   (wchar_t)((ulong)v1 >> 0x20),(wchar_t)v1,a_01,paVar2);
  close(iVar1);
  archive_read_free((archive *)0x1c4a52);
  assertion_equal_int((char *)in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb4,v1,a_01,0,
                      (char *)0x1c4a80,in_stack_ffffffffffffffd0);
  __stream = fopen(&stack0xffffffffffffffd8,"rb");
  fread(testdatacopy,1,0xa00000,__stream);
  assertion_equal_int((char *)__stream,in_stack_ffffffffffffffb4,v1,a_01,0,(char *)0x1c4ae2,
                      in_stack_ffffffffffffffd0);
  fclose(__stream);
  assertion_equal_mem(in_stack_00000008,unaff_retaddr,(void *)CONCAT44(uVar6,iVar1),
                      in_stack_fffffffffffffff0,
                      (void *)CONCAT17(in_stack_ffffffffffffffef,
                                       CONCAT16(uVar5,CONCAT24(uVar4,uVar3))),e2,(size_t)f,
                      (char *)entry,a);
  return;
}

Assistant:

DEFINE_TEST(test_read_large)
{
	unsigned int i;
	int tmpfilefd;
	char tmpfilename[] = "test-read_large.XXXXXX";
	size_t used;
	struct archive *a;
	struct archive_entry *entry;
	FILE *f;

	for (i = 0; i < sizeof(testdata); i++)
		testdata[i] = (unsigned char)(rand());

	assert(NULL != (a = archive_write_new()));
	assertA(0 == archive_write_set_format_ustar(a));
	assertA(0 == archive_write_open_memory(a, buff, sizeof(buff), &used));
	assert(NULL != (entry = archive_entry_new()));
	archive_entry_set_size(entry, sizeof(testdata));
	archive_entry_set_mode(entry, S_IFREG | 0777);
	archive_entry_set_pathname(entry, "test");
	assertA(0 == archive_write_header(a, entry));
	archive_entry_free(entry);
	assertA((int)sizeof(testdata) == archive_write_data(a, testdata, sizeof(testdata)));
	assertEqualInt(ARCHIVE_OK, archive_write_free(a));

	assert(NULL != (a = archive_read_new()));
	assertA(0 == archive_read_support_format_all(a));
	assertA(0 == archive_read_support_filter_all(a));
	assertA(0 == archive_read_open_memory(a, buff, sizeof(buff)));
	assertA(0 == archive_read_next_header(a, &entry));
	assertEqualIntA(a, sizeof(testdatacopy),
	    archive_read_data(a, testdatacopy, sizeof(testdatacopy)));
	assertEqualInt(ARCHIVE_OK, archive_read_free(a));
	assertEqualMem(testdata, testdatacopy, sizeof(testdata));


	assert(NULL != (a = archive_read_new()));
	assertA(0 == archive_read_support_format_all(a));
	assertA(0 == archive_read_support_filter_all(a));
	assertA(0 == archive_read_open_memory(a, buff, sizeof(buff)));
	assertA(0 == archive_read_next_header(a, &entry));
#if defined(__BORLANDC__)
	tmpfilefd = open(tmpfilename, O_WRONLY | O_CREAT | O_BINARY);
#else
	tmpfilefd = open(tmpfilename, O_WRONLY | O_CREAT | O_BINARY, 0755);
#endif
	assert(0 < tmpfilefd);
	assertA(0 == archive_read_data_into_fd(a, tmpfilefd));
	close(tmpfilefd);
	assertEqualInt(ARCHIVE_OK, archive_read_free(a));

	f = fopen(tmpfilename, "rb");
	assertEqualInt(sizeof(testdatacopy),
	    fread(testdatacopy, 1, sizeof(testdatacopy), f));
	fclose(f);
	assertEqualMem(testdata, testdatacopy, sizeof(testdata));
}